

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ArchiveProxy.cpp
# Opt level: O0

bool __thiscall
aeron::archive::ArchiveProxy::listRecordingsForUri
          (ArchiveProxy *this,int64_t fromRecordingId,int32_t recordCount,string *channelFragment,
          int32_t streamId,int64_t correlationId,int64_t controlSessionId)

{
  bool bVar1;
  ListRecordingsForUriRequest *pLVar2;
  uint64_t uVar3;
  undefined1 local_70 [8];
  ListRecordingsForUriRequest msg;
  int64_t correlationId_local;
  int32_t streamId_local;
  string *channelFragment_local;
  int32_t recordCount_local;
  int64_t fromRecordingId_local;
  ArchiveProxy *this_local;
  
  msg.m_actingVersion = correlationId;
  io::aeron::archive::codecs::ListRecordingsForUriRequest::ListRecordingsForUriRequest
            ((ListRecordingsForUriRequest *)local_70);
  pLVar2 = wrapAndApplyHeader<io::aeron::archive::codecs::ListRecordingsForUriRequest>
                     (this,(ListRecordingsForUriRequest *)local_70);
  pLVar2 = io::aeron::archive::codecs::ListRecordingsForUriRequest::controlSessionId
                     (pLVar2,controlSessionId);
  pLVar2 = io::aeron::archive::codecs::ListRecordingsForUriRequest::correlationId
                     (pLVar2,msg.m_actingVersion);
  pLVar2 = io::aeron::archive::codecs::ListRecordingsForUriRequest::fromRecordingId
                     (pLVar2,fromRecordingId);
  pLVar2 = io::aeron::archive::codecs::ListRecordingsForUriRequest::recordCount(pLVar2,recordCount);
  pLVar2 = io::aeron::archive::codecs::ListRecordingsForUriRequest::streamId(pLVar2,streamId);
  io::aeron::archive::codecs::ListRecordingsForUriRequest::putChannel(pLVar2,channelFragment);
  uVar3 = io::aeron::archive::codecs::ListRecordingsForUriRequest::encodedLength
                    ((ListRecordingsForUriRequest *)local_70);
  bVar1 = offer(this,(int32_t)uVar3);
  return bVar1;
}

Assistant:

bool ArchiveProxy::listRecordingsForUri(std::int64_t fromRecordingId, std::int32_t recordCount,
                                        const std::string& channelFragment, std::int32_t streamId, std::int64_t correlationId,
                                        std::int64_t controlSessionId) {
    codecs::ListRecordingsForUriRequest msg;

    wrapAndApplyHeader(msg)
        .controlSessionId(controlSessionId)
        .correlationId(correlationId)
        .fromRecordingId(fromRecordingId)
        .recordCount(recordCount)
        .streamId(streamId)
        .putChannel(channelFragment);

    return offer(msg.encodedLength());
}